

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

time_t ns_mgr_poll(ns_mgr *mgr,int milli)

{
  ns_connection *pnVar1;
  int iVar2;
  ssize_t sVar3;
  ns_connection *local_2180;
  ns_connection *c;
  code *pcStack_2170;
  int len;
  ctl_msg ctl_msg;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  time_t tStack_148;
  uint __i;
  time_t current_time;
  undefined1 local_138 [4];
  sock_t max_fd;
  fd_set write_set;
  fd_set read_set;
  timeval tv;
  ns_connection *tmp_conn;
  ns_connection *conn;
  int milli_local;
  ns_mgr *mgr_local;
  
  current_time._4_4_ = -1;
  tStack_148 = time((time_t *)0x0);
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    write_set.fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
  }
  ctl_msg.message._8184_8_ = local_138;
  for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
    *(undefined8 *)(ctl_msg.message._8184_8_ + (ulong)__arr_1._4_4_ * 8) = 0;
  }
  ns_add_to_set(mgr->ctl[1],(fd_set *)(write_set.fds_bits + 0xf),(sock_t *)((long)&current_time + 4)
               );
  pnVar1 = mgr->active_connections;
  while (tmp_conn = pnVar1, tmp_conn != (ns_connection *)0x0) {
    pnVar1 = tmp_conn->next;
    if ((tmp_conn->flags & 0x88) == 0) {
      ns_call(tmp_conn,0,&stack0xfffffffffffffeb8);
    }
    if ((tmp_conn->flags & 0x40) == 0) {
      ns_add_to_set(tmp_conn->sock,(fd_set *)(write_set.fds_bits + 0xf),
                    (sock_t *)((long)&current_time + 4));
    }
    if ((((tmp_conn->flags & 8) != 0) && ((tmp_conn->flags & 0x20) == 0)) ||
       (((tmp_conn->send_iobuf).len != 0 &&
        (((tmp_conn->flags & 8) == 0 && ((tmp_conn->flags & 2) == 0)))))) {
      ns_add_to_set(tmp_conn->sock,(fd_set *)local_138,(sock_t *)((long)&current_time + 4));
    }
    if ((tmp_conn->flags & 0x10) != 0) {
      ns_close_conn(tmp_conn);
    }
  }
  read_set.fds_bits[0xf] = (__fd_mask)(milli / 1000);
  iVar2 = select(current_time._4_4_ + 1,(fd_set *)(write_set.fds_bits + 0xf),(fd_set *)local_138,
                 (fd_set *)0x0,(timeval *)(read_set.fds_bits + 0xf));
  if (0 < iVar2) {
    tStack_148 = time((time_t *)0x0);
    if ((mgr->ctl[1] != -1) &&
       ((write_set.fds_bits[(long)(mgr->ctl[1] / 0x40) + 0xf] &
        1L << ((byte)((long)mgr->ctl[1] % 0x40) & 0x3f)) != 0)) {
      sVar3 = recv(mgr->ctl[1],&stack0xffffffffffffde90,0x2008,0);
      send(mgr->ctl[1],&ctl_msg,1,0);
      if ((7 < (int)sVar3) && (pcStack_2170 != (code *)0x0)) {
        for (local_2180 = ns_next(mgr,(ns_connection *)0x0); local_2180 != (ns_connection *)0x0;
            local_2180 = ns_next(mgr,local_2180)) {
          (*pcStack_2170)(local_2180,0,&ctl_msg);
        }
      }
    }
    pnVar1 = mgr->active_connections;
    while (tmp_conn = pnVar1, tmp_conn != (ns_connection *)0x0) {
      pnVar1 = tmp_conn->next;
      if ((write_set.fds_bits[(long)(tmp_conn->sock / 0x40) + 0xf] &
          1L << ((byte)((long)tmp_conn->sock % 0x40) & 0x3f)) != 0) {
        if ((tmp_conn->flags & 0x80) == 0) {
          tmp_conn->last_io_time = tStack_148;
          ns_read_from_socket(tmp_conn);
        }
        else if ((tmp_conn->flags & 0x100) == 0) {
          accept_conn(tmp_conn);
        }
        else {
          ns_handle_udp(tmp_conn);
        }
      }
      if ((write_set.fds_bits[(long)(tmp_conn->sock / 0x40) + -1] &
          1L << ((byte)((long)tmp_conn->sock % 0x40) & 0x3f)) != 0) {
        if ((tmp_conn->flags & 8) == 0) {
          if ((tmp_conn->flags & 2) == 0) {
            tmp_conn->last_io_time = tStack_148;
            ns_write_to_socket(tmp_conn);
          }
        }
        else {
          ns_read_from_socket(tmp_conn);
        }
      }
    }
  }
  pnVar1 = mgr->active_connections;
  while (tmp_conn = pnVar1, tmp_conn != (ns_connection *)0x0) {
    pnVar1 = tmp_conn->next;
    if (((tmp_conn->flags & 0x10) != 0) ||
       (((tmp_conn->send_iobuf).len == 0 && ((tmp_conn->flags & 1) != 0)))) {
      ns_close_conn(tmp_conn);
    }
  }
  return tStack_148;
}

Assistant:

time_t ns_mgr_poll(struct ns_mgr *mgr, int milli) {
  struct ns_connection *conn, *tmp_conn;
  struct timeval tv;
  fd_set read_set, write_set;
  sock_t max_fd = INVALID_SOCKET;
  time_t current_time = time(NULL);

  FD_ZERO(&read_set);
  FD_ZERO(&write_set);
  ns_add_to_set(mgr->ctl[1], &read_set, &max_fd);

  for (conn = mgr->active_connections; conn != NULL; conn = tmp_conn) {
    tmp_conn = conn->next;
    if (!(conn->flags & (NSF_LISTENING | NSF_CONNECTING))) {
      ns_call(conn, NS_POLL, &current_time);
    }
    if (!(conn->flags & NSF_WANT_WRITE)) {
      //DBG(("%p read_set", conn));
      ns_add_to_set(conn->sock, &read_set, &max_fd);
    }
    if (((conn->flags & NSF_CONNECTING) && !(conn->flags & NSF_WANT_READ)) ||
        (conn->send_iobuf.len > 0 && !(conn->flags & NSF_CONNECTING) &&
         !(conn->flags & NSF_BUFFER_BUT_DONT_SEND))) {
      //DBG(("%p write_set", conn));
      ns_add_to_set(conn->sock, &write_set, &max_fd);
    }
    if (conn->flags & NSF_CLOSE_IMMEDIATELY) {
      ns_close_conn(conn);
    }
  }

  tv.tv_sec = milli / 1000;
  tv.tv_usec = (milli % 1000) * 1000;

  if (select((int) max_fd + 1, &read_set, &write_set, NULL, &tv) > 0) {
    // select() might have been waiting for a long time, reset current_time
    // now to prevent last_io_time being set to the past.
    current_time = time(NULL);

    // Read wakeup messages
    if (mgr->ctl[1] != INVALID_SOCKET &&
        FD_ISSET(mgr->ctl[1], &read_set)) {
      struct ctl_msg ctl_msg;
      int len = (int) recv(mgr->ctl[1], (char *) &ctl_msg, sizeof(ctl_msg), 0);
      send(mgr->ctl[1], ctl_msg.message, 1, 0);
      if (len >= (int) sizeof(ctl_msg.callback) && ctl_msg.callback != NULL) {
        struct ns_connection *c;
        for (c = ns_next(mgr, NULL); c != NULL; c = ns_next(mgr, c)) {
          ctl_msg.callback(c, NS_POLL, ctl_msg.message);
        }
      }
    }

    for (conn = mgr->active_connections; conn != NULL; conn = tmp_conn) {
      tmp_conn = conn->next;
      if (FD_ISSET(conn->sock, &read_set)) {
        if (conn->flags & NSF_LISTENING) {
          if (conn->flags & NSF_UDP) {
            ns_handle_udp(conn);
          } else {
            // We're not looping here, and accepting just one connection at
            // a time. The reason is that eCos does not respect non-blocking
            // flag on a listening socket and hangs in a loop.
            accept_conn(conn);
          }
        } else {
          conn->last_io_time = current_time;
          ns_read_from_socket(conn);
        }
      }

      if (FD_ISSET(conn->sock, &write_set)) {
        if (conn->flags & NSF_CONNECTING) {
          ns_read_from_socket(conn);
        } else if (!(conn->flags & NSF_BUFFER_BUT_DONT_SEND)) {
          conn->last_io_time = current_time;
          ns_write_to_socket(conn);
        }
      }
    }
  }

  for (conn = mgr->active_connections; conn != NULL; conn = tmp_conn) {
    tmp_conn = conn->next;
    if ((conn->flags & NSF_CLOSE_IMMEDIATELY) ||
        (conn->send_iobuf.len == 0 &&
          (conn->flags & NSF_FINISHED_SENDING_DATA))) {
      ns_close_conn(conn);
    }
  }

  return current_time;
}